

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void gc_pose_log(gc_pose *x)

{
  matrix3x3 *pmVar1;
  vector3 *pvVar2;
  uint __line;
  int i;
  long lVar3;
  char *__assertion;
  long lVar4;
  
  if (x == (gc_pose *)0x0) {
    __assertion = "x";
    __line = 0x3a;
  }
  else {
    if ((x->rotation != (matrix3x3 *)0x0) && (x->translation != (vector3 *)0x0)) {
      printf("PoseCoord(rotation=[");
      lVar4 = 0x10;
      lVar3 = 0;
      do {
        if (lVar3 != 0) {
          if (lVar3 == 3) {
            pvVar2 = x->translation;
            printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",(pvVar2->field_0).field_0.x,
                   (pvVar2->field_0).field_0.y,(pvVar2->field_0).field_0.z);
            return;
          }
          printf("                    ");
        }
        pmVar1 = x->rotation;
        printf("[%5.2f, %5.2f, %5.2f]",*(undefined8 *)((long)pmVar1 + lVar4 + -0x10),
               *(undefined8 *)((long)pmVar1 + lVar4 + -8),
               *(undefined8 *)((long)&pmVar1->field_0 + lVar4));
        if (lVar3 != 2) {
          puts(",");
        }
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x18;
      } while( true );
    }
    __assertion = "x->rotation && x->translation";
    __line = 0x3b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,__line,"void gc_pose_log(const struct gc_pose *)");
}

Assistant:

void gc_pose_log(
        const struct gc_pose *x)
{
    assert(x);
    assert(x->rotation && x->translation);

    printf("PoseCoord(rotation=[");
    for (int i = 0; i < 3; i++) {
        if (i != 0) printf("                    ");
        printf("[%5.2f, %5.2f, %5.2f]",
                x->rotation->row[i].x,
                x->rotation->row[i].y,
                x->rotation->row[i].z);
        if (i != 2) printf(",\n");
    }
    printf("],\n       translation=[[%5.3f, %5.3f, %5.3f]])\n",
            x->translation->x,
            x->translation->y,
            x->translation->z);
}